

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

cmSourceFile * __thiscall
cmQtAutoGenInitializer::AddGeneratedSource
          (cmQtAutoGenInitializer *this,string *filename,GenVarsT *genVars,bool prepend)

{
  cmSourceFile *pcVar1;
  
  pcVar1 = RegisterGeneratedSource(this,filename);
  cmGeneratorTarget::AddSource(this->GenTarget,filename,prepend);
  AddToSourceGroup(this,filename,genVars->GenNameUpper);
  return pcVar1;
}

Assistant:

cmSourceFile* cmQtAutoGenInitializer::AddGeneratedSource(
  std::string const& filename, GenVarsT const& genVars, bool prepend)
{
  // Register source at makefile
  cmSourceFile* gFile = this->RegisterGeneratedSource(filename);
  // Add source file to target
  this->GenTarget->AddSource(filename, prepend);

  // Add source file to source group
  this->AddToSourceGroup(filename, genVars.GenNameUpper);

  return gFile;
}